

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructBuilder * __thiscall
capnp::_::PointerBuilder::getStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size,
          word *defaultValue)

{
  ushort uVar1;
  uint uVar2;
  word *pwVar3;
  BuilderArena *pBVar4;
  AllocateResult AVar5;
  AllocateResult AVar6;
  StructSize SVar7;
  WirePointer *pWVar8;
  SegmentBuilder *pSVar9;
  SegmentBuilder *pSVar10;
  ushort uVar11;
  undefined8 *puVar12;
  int iVar13;
  ushort uVar14;
  WirePointer *pWVar15;
  word *result;
  WirePointer *__dest;
  uint uVar16;
  uint uVar17;
  WirePointer *pWVar18;
  ulong uVar19;
  bool bVar20;
  AllocateResult AVar21;
  AllocateResult AVar22;
  ushort local_98;
  WirePointer *local_90;
  SegmentBuilder *local_88;
  undefined8 local_80;
  CapTableBuilder *local_78;
  WirePointer *local_70;
  StructBuilder *local_68;
  ulong local_60;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  local_90 = this->pointer;
  local_88 = this->segment;
  local_78 = this->capTable;
  uVar17 = (local_90->offsetAndKind).value;
  uVar14 = size.pointers;
  local_98 = size.data;
  local_68 = __return_storage_ptr__;
  if ((local_90->field_1).upper32Bits == 0 && uVar17 == 0) goto LAB_00148059;
  pWVar8 = local_90 + (long)((int)uVar17 >> 2) + 1;
  while( true ) {
    pWVar18 = local_90;
    pSVar9 = local_88;
    if ((uVar17 & 3) == 2) {
      pSVar9 = BuilderArena::getSegment
                         ((BuilderArena *)(local_88->super_SegmentReader).arena,
                          (SegmentId)(local_90->field_1).structRef);
      uVar17 = (pWVar18->offsetAndKind).value;
      pwVar3 = (pSVar9->super_SegmentReader).ptr.ptr;
      uVar19 = (ulong)(uVar17 & 0xfffffff8);
      pWVar15 = (WirePointer *)((long)&pwVar3->content + uVar19);
      pWVar18 = (WirePointer *)((long)&pwVar3[1].content + uVar19);
      if ((uVar17 & 4) == 0) {
        pWVar8 = pWVar18 + ((int)(pWVar15->offsetAndKind).value >> 2);
        pWVar18 = pWVar15;
      }
      else {
        pSVar9 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar9->super_SegmentReader).arena,
                            (SegmentId)(pWVar15->field_1).structRef);
        pWVar8 = (WirePointer *)
                 ((long)&((pSVar9->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar15->offsetAndKind).value & 0xfffffff8));
      }
    }
    pWVar15 = local_90;
    if (pSVar9->readOnly == true) {
      SegmentBuilder::throwNotWritable(pSVar9);
    }
    _kjCondition.right = STRUCT;
    _kjCondition.left = (pWVar18->offsetAndKind).value & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) break;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
               ,&_kjCondition,
               (char (*) [88])
               "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
              );
    kj::_::Debug::Fault::~Fault(&f);
LAB_00148059:
    pSVar9 = local_88;
    __dest = local_90;
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      AVar5.words = (word *)local_90;
      AVar5.segment = local_88;
      AVar21.words = (word *)local_90;
      AVar21.segment = local_88;
      SVar7 = (StructSize)((uint)size & 0xffff);
      uVar17 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
      if ((local_90->field_1).upper32Bits != 0 || (local_90->offsetAndKind).value != 0) {
        WireHelpers::zeroObject(local_88,local_78,local_90);
      }
      if (uVar17 == 0) {
        (__dest->offsetAndKind).value = 0xfffffffc;
      }
      else {
        pWVar8 = (WirePointer *)pSVar9->pos;
        if (((long)((long)(pSVar9->super_SegmentReader).ptr.ptr +
                   ((pSVar9->super_SegmentReader).ptr.size_ * 8 - (long)pWVar8)) >> 3 <
             (long)(ulong)uVar17) ||
           (pSVar9->pos = (word *)(pWVar8 + uVar17), pWVar8 == (WirePointer *)0x0)) {
          pBVar4 = (BuilderArena *)(pSVar9->super_SegmentReader).arena;
          uVar17 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                             (uVar17 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
          AVar21 = BuilderArena::allocate(pBVar4,uVar17);
          (__dest->offsetAndKind).value =
               (int)AVar21.words - *(int *)&((AVar21.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          __dest->field_1 =
               (anon_union_4_5_35ddcec3_for_WirePointer_1)
               ((AVar21.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar21.words)->content = 0;
          __dest = (WirePointer *)(AVar21.words + 1);
        }
        else {
          (__dest->offsetAndKind).value =
               ((uint)((ulong)((long)pWVar8 - (long)__dest) >> 1) & 0xfffffffc) - 4;
          __dest = pWVar8;
          AVar21 = AVar5;
        }
      }
      pSVar9 = AVar21.segment;
      *(ushort *)((long)&(AVar21.words)->content + 4) = local_98;
      *(ushort *)((long)&(AVar21.words)->content + 6) = uVar14;
      pWVar18 = __dest + ((uint)size & 0xffff);
      uVar11 = uVar14;
LAB_001482d4:
      local_68->segment = pSVar9;
      local_68->capTable = local_78;
      local_68->data = __dest;
      local_68->pointers = pWVar18;
      local_68->dataSize = (int)SVar7 << 6;
      local_68->pointerCount = uVar11;
      return local_68;
    }
    pWVar8 = (WirePointer *)
             WireHelpers::copyMessage(&local_88,local_78,&local_90,(WirePointer *)defaultValue);
    uVar17 = (local_90->offsetAndKind).value;
    defaultValue = (word *)0x0;
  }
  uVar1 = *(ushort *)&pWVar18->field_1;
  uVar19 = (ulong)uVar1;
  uVar11 = *(ushort *)((long)&pWVar18->field_1 + 2);
  pWVar18 = pWVar8 + uVar19;
  SVar7.pointers = 0;
  SVar7.data = uVar1;
  __dest = pWVar8;
  if (uVar11 < uVar14 || uVar1 < local_98) {
    if (uVar1 <= local_98) {
      SVar7 = size;
    }
    uVar17 = (uint)size >> 0x10;
    if (uVar14 < uVar11) {
      uVar17 = (uint)uVar11;
    }
    local_70 = (WirePointer *)CONCAT44(local_70._4_4_,SVar7);
    SVar7 = (StructSize)((uint)SVar7 & 0xffff);
    uVar16 = uVar17;
    if (((local_90->offsetAndKind).value & 3) == 2) {
      local_80 = CONCAT44(local_80._4_4_,uVar17);
      pSVar10 = BuilderArena::getSegment
                          ((BuilderArena *)(local_88->super_SegmentReader).arena,
                           (SegmentId)(local_90->field_1).structRef);
      uVar16 = (uint)local_80;
      if (pSVar10->readOnly == false) {
        uVar2 = (pWVar15->offsetAndKind).value;
        puVar12 = (undefined8 *)
                  ((long)&((pSVar10->super_SegmentReader).ptr.ptr)->content +
                  (ulong)(uVar2 & 0xfffffff8));
        if ((uVar2 & 4) == 0) {
          *puVar12 = 0;
        }
        else {
          *puVar12 = 0;
          puVar12[1] = 0;
        }
      }
    }
    uVar16 = uVar16 + (int)SVar7;
    pWVar15->offsetAndKind = 0;
    pWVar15->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    if ((local_90->field_1).upper32Bits != 0 || (local_90->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(local_88,local_78,local_90);
    }
    AVar22.words = (word *)local_90;
    AVar22.segment = local_88;
    AVar6.words = (word *)local_90;
    AVar6.segment = local_88;
    local_80 = uVar19;
    if (uVar16 == 0) {
      (local_90->offsetAndKind).value = 0xfffffffc;
      __dest = local_90;
    }
    else {
      __dest = (WirePointer *)local_88->pos;
      if (((long)((long)(local_88->super_SegmentReader).ptr.ptr +
                 ((local_88->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
           (long)(ulong)uVar16) ||
         (local_88->pos = (word *)(__dest + uVar16), __dest == (WirePointer *)0x0)) {
        pBVar4 = (BuilderArena *)(local_88->super_SegmentReader).arena;
        uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                           (uVar16 + 1,(anon_class_1_0_00000001 *)&_kjCondition);
        AVar22 = BuilderArena::allocate(pBVar4,uVar16);
        (local_90->offsetAndKind).value =
             (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
             0xfffffff8U | 2;
        local_90->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)
             ((AVar22.segment)->super_SegmentReader).id.value;
        *(undefined4 *)&(AVar22.words)->content = 0;
        __dest = (WirePointer *)(AVar22.words + 1);
      }
      else {
        (local_90->offsetAndKind).value =
             ((uint)((ulong)((long)__dest - (long)local_90) >> 1) & 0xfffffffc) - 4;
        AVar22 = AVar6;
      }
    }
    local_90 = (WirePointer *)AVar22.words;
    local_88 = AVar22.segment;
    uVar19 = (ulong)uVar11;
    uVar16 = (uint)local_70;
    (local_90->field_1).structRef.dataSize.value = (unsigned_short)local_70;
    uVar11 = (ushort)uVar17;
    (local_90->field_1).structRef.ptrCount.value = uVar11;
    if ((int)local_80 != 0) {
      memcpy(__dest,pWVar8,(ulong)(uint)((int)local_80 << 3));
      AVar22.words = (word *)local_90;
      AVar22.segment = local_88;
    }
    pWVar15 = __dest + (uVar16 & 0xffff);
    local_70 = pWVar15;
    local_60 = uVar19;
    while( true ) {
      local_90 = (WirePointer *)AVar22.words;
      local_88 = AVar22.segment;
      bVar20 = uVar19 == 0;
      uVar19 = uVar19 - 1;
      if (bVar20) break;
      WireHelpers::transferPointer(local_88,pWVar15,pSVar9,pWVar18);
      AVar22.words = (word *)local_90;
      AVar22.segment = local_88;
      pWVar15 = pWVar15 + 1;
      pWVar18 = pWVar18 + 1;
    }
    iVar13 = (int)local_60 + (uint)local_80;
    pWVar18 = local_70;
    pSVar9 = local_88;
    if (iVar13 != 0) {
      memset(pWVar8,0,(ulong)(uint)(iVar13 * 8));
      pWVar18 = local_70;
      pSVar9 = local_88;
    }
  }
  goto LAB_001482d4;
}

Assistant:

StructBuilder PointerBuilder::getStruct(StructSize size, const word* defaultValue) {
  return WireHelpers::getWritableStructPointer(pointer, segment, capTable, size, defaultValue);
}